

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

int Bmc_CexVerify(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexCare)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
  iVar10 = p->nRegs;
  if (0 < iVar10) {
    iVar14 = 0;
    do {
      iVar12 = p->vCos->nSize;
      uVar15 = (iVar12 - iVar10) + iVar14;
      if (((int)uVar15 < 0) || (iVar12 <= (int)uVar15)) goto LAB_0052a080;
      iVar12 = p->vCos->pArray[uVar15];
      lVar6 = (long)iVar12;
      if ((lVar6 < 0) || (p->nObjs <= iVar12)) goto LAB_0052a061;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar4 + lVar6) = *(ulong *)(pGVar4 + lVar6) & 0xbfffffffbfffffff | 0x40000000;
      iVar14 = iVar14 + 1;
      iVar10 = p->nRegs;
    } while (iVar14 < iVar10);
  }
  if (pCex->iFrame < 0) {
    pVVar7 = p->vCos;
  }
  else {
    uVar13 = 0x4000000000000000;
    iVar10 = 0;
    do {
      iVar14 = p->nRegs;
      pVVar7 = p->vCis;
      iVar12 = pVVar7->nSize;
      if (iVar14 < iVar12) {
        lVar6 = 0;
        do {
          if (iVar12 <= lVar6) goto LAB_0052a080;
          iVar12 = pVVar7->pArray[lVar6];
          if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_0052a061;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar12;
          uVar15 = pCexCare->nPis * iVar10 + pCexCare->nRegs + (int)lVar6;
          if (((uint)(&pCexCare[1].iPo)[(int)uVar15 >> 5] >> (uVar15 & 0x1f) & 1) == 0) {
            uVar8 = *(ulong *)pGVar4 | 0x4000000040000000;
          }
          else {
            uVar15 = pCex->nPis * iVar10 + pCex->nRegs + (int)lVar6;
            if (((uint)(&pCex[1].iPo)[(int)uVar15 >> 5] >> (uVar15 & 0x1f) & 1) == 0) {
              uVar8 = *(ulong *)pGVar4 & 0xbfffffffbfffffff | 0x40000000;
            }
            else {
              uVar8 = *(ulong *)pGVar4 & 0xbfffffffbfffffff | 0x4000000000000000;
            }
          }
          *(ulong *)pGVar4 = uVar8;
          lVar6 = lVar6 + 1;
          iVar14 = p->nRegs;
          pVVar7 = p->vCis;
          iVar12 = pVVar7->nSize;
        } while (lVar6 < iVar12 - iVar14);
      }
      if (0 < iVar14) {
        iVar12 = 0;
        do {
          iVar2 = p->vCis->nSize;
          uVar15 = iVar12 + (iVar2 - iVar14);
          if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_0052a080;
          iVar3 = p->vCis->pArray[uVar15];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0052a061;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar4 + iVar3;
          uVar8 = *(ulong *)pGVar1;
          if (((~(uint)uVar8 & 0x9fffffff) != 0) ||
             (uVar15 = (uint)(uVar8 >> 0x20) & 0x1fffffff, (int)uVar15 < iVar2 - iVar14)) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar14 = p->vCos->nSize;
          uVar15 = (iVar14 - iVar2) + uVar15;
          if (((int)uVar15 < 0) || (iVar14 <= (int)uVar15)) goto LAB_0052a080;
          uVar15 = p->vCos->pArray[uVar15];
          lVar6 = (long)(int)uVar15;
          if ((lVar6 < 0) || ((uint)p->nObjs <= uVar15)) goto LAB_0052a061;
          if ((*(ulong *)(pGVar4 + lVar6) & 0x4000000040000000) == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x356,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar9 = *(ulong *)(pGVar4 + lVar6) & 0x40000000;
          *(ulong *)pGVar1 = uVar8 & 0xffffffffbfffffff | uVar9;
          *(ulong *)pGVar1 =
               uVar8 & 0xbfffffffbfffffff | uVar9 | *(ulong *)(pGVar4 + lVar6) & 0x4000000000000000;
          iVar12 = iVar12 + 1;
          iVar14 = p->nRegs;
        } while (iVar12 < iVar14);
      }
      iVar14 = p->nObjs;
      if (0 < iVar14) {
        lVar6 = 0;
        lVar18 = 0;
        do {
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar8 = *(ulong *)(&pGVar4->field_0x0 + lVar6);
          uVar15 = (uint)uVar8;
          if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar15) {
            uVar9 = *(ulong *)((long)pGVar4 +
                              lVar6 + (ulong)(uint)((int)(uVar8 & 0x1fffffff) << 2) * -3) &
                    0x4000000040000000;
            if (uVar9 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x33e,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar11 = *(ulong *)((long)pGVar4 +
                               lVar6 + (ulong)((uint)(uVar8 >> 0x1e) & 0x7ffffffc) * -3) &
                     0x4000000040000000;
            if (uVar11 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x33f,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar16 = uVar13;
            if ((uVar15 >> 0x1d & 1) == 0) {
              uVar16 = 0x40000000;
            }
            if (uVar9 == uVar16) {
LAB_00529eac:
              uVar8 = uVar8 & 0xbfffffff3fffffff | 0x40000000;
            }
            else {
              uVar16 = uVar13;
              if ((uVar8 >> 0x3d & 1) == 0) {
                uVar16 = 0x40000000;
              }
              if (uVar11 == uVar16) goto LAB_00529eac;
              uVar16 = 0x40000000;
              if ((uVar15 >> 0x1d & 1) == 0) {
                uVar16 = uVar13;
              }
              uVar17 = 0x40000000;
              if ((uVar8 >> 0x3d & 1) == 0) {
                uVar17 = uVar13;
              }
              if ((uVar9 == uVar16) && (uVar11 == uVar17)) {
                uVar8 = uVar8 & 0xbfffffff3fffffff | 0x4000000000000000;
              }
              else {
                uVar8 = uVar8 | 0x4000000040000000;
              }
            }
            *(ulong *)(&pGVar4->field_0x0 + lVar6) = uVar8;
            iVar14 = p->nObjs;
          }
          lVar18 = lVar18 + 1;
          lVar6 = lVar6 + 0xc;
        } while (lVar18 < iVar14);
      }
      pVVar7 = p->vCos;
      if (0 < pVVar7->nSize) {
        lVar6 = 0;
        do {
          iVar14 = pVVar7->pArray[lVar6];
          if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_0052a061;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar14;
          uVar8 = *(ulong *)pGVar4;
          uVar15 = (uint)uVar8;
          if ((-1 < (int)uVar15) || ((uVar15 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x349,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          uVar9 = *(ulong *)(pGVar4 + -(ulong)(uVar15 & 0x1fffffff)) & 0x4000000040000000;
          if (uVar9 == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x34a,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          if (((uVar15 >> 0x1d & 1) == 0) || (uVar9 != 0x4000000000000000)) {
            if (uVar9 == 0x4000000000000000) {
              if ((uVar15 >> 0x1d & 1) != 0) goto LAB_00529fc9;
LAB_00529fc1:
              uVar8 = uVar8 & 0xbfffffffbfffffff | 0x4000000000000000;
            }
            else {
              if (uVar9 == 0x40000000) {
                if ((uVar15 >> 0x1d & 1) != 0) goto LAB_00529fc1;
                goto LAB_00529f98;
              }
LAB_00529fc9:
              uVar8 = uVar8 | 0x4000000040000000;
            }
          }
          else {
LAB_00529f98:
            uVar8 = uVar8 & 0xbfffffffbfffffff | 0x40000000;
          }
          *(ulong *)pGVar4 = uVar8;
          lVar6 = lVar6 + 1;
          pVVar7 = p->vCos;
        } while (lVar6 < pVVar7->nSize);
      }
      bVar5 = iVar10 < pCex->iFrame;
      iVar10 = iVar10 + 1;
    } while (bVar5);
    iVar10 = p->nRegs;
  }
  uVar15 = pCex->iPo;
  if (pVVar7->nSize - iVar10 <= (int)uVar15) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar15) && ((int)uVar15 < pVVar7->nSize)) {
    iVar10 = pVVar7->pArray[uVar15];
    if ((-1 < (long)iVar10) && (iVar10 < p->nObjs)) {
      return (uint)(((uint)*(undefined8 *)(p->pObjs + iVar10) >> 0x1e & 1) == 0) &
             (uint)((ulong)*(undefined8 *)(p->pObjs + iVar10) >> 0x3e);
    }
LAB_0052a061:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0052a080:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Bmc_CexVerify( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexCare )
{
    Gia_Obj_t * pObj;
    int i, k;
//    assert( pCex->nRegs > 0 );
//    assert( pCexCare->nRegs == 0 );
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
        {
            if ( !Abc_InfoHasBit( pCexCare->pData, pCexCare->nRegs + i * pCexCare->nPis + k ) )
                Gia_ObjTerSimSetX( pObj );
            else if ( Abc_InfoHasBit( pCex->pData, pCex->nRegs + i * pCex->nPis + k ) )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
    }
    pObj = Gia_ManPo( p, pCex->iPo );
    return Gia_ObjTerSimGet1(pObj);
}